

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode override_login(Curl_easy *data,connectdata *conn)

{
  char **ppcVar1;
  char **passwordp;
  undefined1 *puVar2;
  byte bVar3;
  curl_trc_feat *pcVar4;
  CURLcode CVar5;
  CURLUcode CVar6;
  NETRCcode ret;
  uchar *str;
  char *pcVar7;
  byte *pbVar8;
  char *pcVar9;
  char **ppcVar10;
  bool bVar11;
  
  if ((data->set).str[0x2f] == (char *)0x0) {
LAB_00162271:
    ppcVar1 = &conn->user;
    passwordp = &conn->passwd;
    if ((data->set).use_netrc == '\x02') {
      (*Curl_cfree)(*ppcVar1);
      *ppcVar1 = (char *)0x0;
      (*Curl_cfree)(*passwordp);
      *passwordp = (char *)0x0;
    }
    puVar2 = &(conn->bits).field_0x2;
    *puVar2 = *puVar2 & 0xf7;
    ppcVar10 = ppcVar1;
    if (((data->set).use_netrc == '\0') || ((data->set).str[0x2d] != (char *)0x0)) {
      pcVar7 = *ppcVar1;
      if (pcVar7 != (char *)0x0) goto LAB_001622cf;
    }
    else {
      if ((data->state).aptr.user == (char *)0x0) {
        bVar11 = false;
      }
      else {
        bVar11 = (~*(uint *)&(data->state).field_0x7be & 3) != 0;
        ppcVar10 = &(data->state).aptr.user;
        if (!bVar11) {
          ppcVar10 = ppcVar1;
        }
      }
      if (*passwordp == (char *)0x0) {
        ret = Curl_parsenetrc(&(data->state).netrc,(conn->host).name,ppcVar10,passwordp,
                              (data->set).str[0x25]);
        if (ret == NETRC_OK) {
          if ((conn->handler->flags & 0x2000) == 0) {
            pbVar8 = (byte *)*ppcVar10;
            do {
              bVar3 = *pbVar8;
              pbVar8 = pbVar8 + 1;
            } while (0x1f < bVar3);
            if (bVar3 != 0) {
LAB_00162567:
              Curl_failf(data,"control code detected in .netrc credentials");
              return CURLE_READ_ERROR;
            }
            pbVar8 = (byte *)*passwordp;
            do {
              bVar3 = *pbVar8;
              pbVar8 = pbVar8 + 1;
            } while (0x1f < bVar3);
            if (bVar3 != 0) goto LAB_00162567;
          }
          puVar2 = &(conn->bits).field_0x2;
          *puVar2 = *puVar2 | 8;
        }
        else {
          if ((ret != NETRC_NO_MATCH) && ((data->set).use_netrc != '\x01')) {
            pcVar7 = Curl_netrc_strerror(ret);
            Curl_failf(data,".netrc error: %s",pcVar7);
            return CURLE_READ_ERROR;
          }
          if ((((data->set).field_0x89f & 0x40) != 0) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            pcVar7 = (data->set).str[0x25];
            pcVar9 = ".netrc";
            if (pcVar7 != (char *)0x0) {
              pcVar9 = pcVar7;
            }
            Curl_infof(data,"Couldn\'t find host %s in the %s file; using defaults",
                       (conn->host).name,pcVar9);
          }
        }
      }
      if (bVar11) {
        (*Curl_cfree)(*ppcVar1);
        pcVar7 = (*Curl_cstrdup)(*ppcVar10);
        *ppcVar1 = pcVar7;
        if (pcVar7 == (char *)0x0) goto switchD_00162333_caseD_7;
      }
      pcVar7 = *ppcVar10;
      if (pcVar7 == (char *)0x0) {
        if (*passwordp == (char *)0x0) goto LAB_001622f3;
        pcVar7 = (*Curl_cstrdup)("");
        *ppcVar10 = pcVar7;
        if (pcVar7 == (char *)0x0) goto switchD_00162333_caseD_7;
      }
LAB_001622cf:
      if ((data->state).aptr.user != pcVar7) {
        CVar5 = Curl_setstropt(&(data->state).aptr.user,pcVar7);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
        puVar2 = &(data->state).field_0x7be;
        *puVar2 = *puVar2 | 3;
      }
    }
LAB_001622f3:
    pcVar7 = (data->state).aptr.user;
    if (pcVar7 != (char *)0x0) {
      CVar6 = curl_url_set((data->state).uh,CURLUPART_USER,pcVar7,0x80);
      CVar5 = CURLE_URL_MALFORMAT;
      switch(CVar6) {
      case CURLUE_OK:
        if (*ppcVar10 == (char *)0x0) {
          pcVar7 = (*Curl_cstrdup)((data->state).aptr.user);
          *ppcVar10 = pcVar7;
          if (pcVar7 == (char *)0x0) goto switchD_00162333_caseD_7;
        }
        break;
      default:
        goto switchD_00162333_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_00162333_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_00162333_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_00162333_caseD_8;
      }
    }
    if (*passwordp != (char *)0x0) {
      CVar5 = Curl_setstropt(&(data->state).aptr.passwd,*passwordp);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      puVar2 = &(data->state).field_0x7be;
      *puVar2 = *puVar2 | 3;
    }
    pcVar7 = (data->state).aptr.passwd;
    if (pcVar7 != (char *)0x0) {
      CVar5 = CURLE_URL_MALFORMAT;
      CVar6 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,pcVar7,0x80);
      switch(CVar6) {
      case CURLUE_OK:
        if (*passwordp == (char *)0x0) {
          pcVar7 = (*Curl_cstrdup)((data->state).aptr.passwd);
          *passwordp = pcVar7;
          if (pcVar7 == (char *)0x0) goto switchD_00162333_caseD_7;
        }
        break;
      default:
        goto switchD_00162333_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_00162333_caseD_5:
        return CURLE_UNSUPPORTED_PROTOCOL;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_00162333_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
switchD_00162333_caseD_8:
        return CURLE_LOGIN_DENIED;
      }
    }
    CVar5 = CURLE_OK;
  }
  else {
    (*Curl_cfree)(conn->options);
    pcVar7 = (*Curl_cstrdup)((data->set).str[0x2f]);
    conn->options = pcVar7;
    if (pcVar7 != (char *)0x0) goto LAB_00162271;
switchD_00162333_caseD_7:
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
switchD_00162333_caseD_1:
  return CVar5;
}

Assistant:

static CURLcode override_login(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLUcode uc;
  char **userp = &conn->user;
  char **passwdp = &conn->passwd;
  char **optionsp = &conn->options;

  if(data->set.str[STRING_OPTIONS]) {
    free(*optionsp);
    *optionsp = strdup(data->set.str[STRING_OPTIONS]);
    if(!*optionsp)
      return CURLE_OUT_OF_MEMORY;
  }

#ifndef CURL_DISABLE_NETRC
  if(data->set.use_netrc == CURL_NETRC_REQUIRED) {
    Curl_safefree(*userp);
    Curl_safefree(*passwdp);
  }
  conn->bits.netrc = FALSE;
  if(data->set.use_netrc && !data->set.str[STRING_USERNAME]) {
    bool url_provided = FALSE;

    if(data->state.aptr.user &&
       (data->state.creds_from != CREDS_NETRC)) {
      /* there was a username with a length in the URL. Use the URL decoded
         version */
      userp = &data->state.aptr.user;
      url_provided = TRUE;
    }

    if(!*passwdp) {
      NETRCcode ret = Curl_parsenetrc(&data->state.netrc, conn->host.name,
                                      userp, passwdp,
                                      data->set.str[STRING_NETRC_FILE]);
      if(ret && ((ret == NETRC_NO_MATCH) ||
                 (data->set.use_netrc == CURL_NETRC_OPTIONAL))) {
        infof(data, "Couldn't find host %s in the %s file; using defaults",
              conn->host.name,
              (data->set.str[STRING_NETRC_FILE] ?
               data->set.str[STRING_NETRC_FILE] : ".netrc"));
      }
      else if(ret) {
        const char *m = Curl_netrc_strerror(ret);
        failf(data, ".netrc error: %s", m);
        return CURLE_READ_ERROR;
      }
      else {
        if(!(conn->handler->flags&PROTOPT_USERPWDCTRL)) {
          /* if the protocol can't handle control codes in credentials, make
             sure there are none */
          if(str_has_ctrl(*userp) || str_has_ctrl(*passwdp)) {
            failf(data, "control code detected in .netrc credentials");
            return CURLE_READ_ERROR;
          }
        }
        /* set bits.netrc TRUE to remember that we got the name from a .netrc
           file, so that it is safe to use even if we followed a Location: to a
           different host or similar. */
        conn->bits.netrc = TRUE;
      }
    }
    if(url_provided) {
      free(conn->user);
      conn->user = strdup(*userp);
      if(!conn->user)
        return CURLE_OUT_OF_MEMORY;
    }
    /* no user was set but a password, set a blank user */
    if(!*userp && *passwdp) {
      *userp = strdup("");
      if(!*userp)
        return CURLE_OUT_OF_MEMORY;
    }
  }
#endif

  /* for updated strings, we update them in the URL */
  if(*userp) {
    CURLcode result;
    if(data->state.aptr.user != *userp) {
      /* nothing to do then */
      result = Curl_setstropt(&data->state.aptr.user, *userp);
      if(result)
        return result;
      data->state.creds_from = CREDS_NETRC;
    }
  }
  if(data->state.aptr.user) {
    uc = curl_url_set(data->state.uh, CURLUPART_USER, data->state.aptr.user,
                      CURLU_URLENCODE);
    if(uc)
      return Curl_uc_to_curlcode(uc);
    if(!*userp) {
      *userp = strdup(data->state.aptr.user);
      if(!*userp)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  if(*passwdp) {
    CURLcode result = Curl_setstropt(&data->state.aptr.passwd, *passwdp);
    if(result)
      return result;
    data->state.creds_from = CREDS_NETRC;
  }
  if(data->state.aptr.passwd) {
    uc = curl_url_set(data->state.uh, CURLUPART_PASSWORD,
                      data->state.aptr.passwd, CURLU_URLENCODE);
    if(uc)
      return Curl_uc_to_curlcode(uc);
    if(!*passwdp) {
      *passwdp = strdup(data->state.aptr.passwd);
      if(!*passwdp)
        return CURLE_OUT_OF_MEMORY;
    }
  }

  return CURLE_OK;
}